

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

SVGPatternAttributes * __thiscall
lunasvg::SVGPatternElement::collectPatternAttributes
          (SVGPatternAttributes *__return_storage_ptr__,SVGPatternElement *this)

{
  bool bVar1;
  ElementID EVar2;
  uint uVar3;
  SVGNodeList *this_00;
  reference this_01;
  pointer pSVar4;
  SVGURIReference *this_02;
  Document *document;
  SVGPatternElement *this_03;
  size_type sVar5;
  SVGElement *targetElement;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *child;
  const_iterator __end3;
  const_iterator __begin3;
  SVGNodeList *__range3;
  SVGPatternElement *local_48;
  SVGPatternElement *current;
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  processedPatterns;
  SVGPatternElement *this_local;
  
  processedPatterns._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  SVGPatternAttributes::SVGPatternAttributes(__return_storage_ptr__);
  std::
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  ::set((set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
         *)&current);
  local_48 = this;
  do {
    bVar1 = SVGPatternAttributes::hasX(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,X), bVar1)) {
      SVGPatternAttributes::setX(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasY(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,Y), bVar1)) {
      SVGPatternAttributes::setY(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasWidth(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,Width), bVar1)) {
      SVGPatternAttributes::setWidth(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasHeight(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,Height), bVar1)) {
      SVGPatternAttributes::setHeight(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasPatternTransform(__return_storage_ptr__);
    if ((!bVar1) &&
       (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,PatternTransform), bVar1)) {
      SVGPatternAttributes::setPatternTransform(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasPatternUnits(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,PatternUnits), bVar1))
    {
      SVGPatternAttributes::setPatternUnits(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasPatternContentUnits(__return_storage_ptr__);
    if ((!bVar1) &&
       (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,PatternContentUnits), bVar1)) {
      SVGPatternAttributes::setPatternContentUnits(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasViewBox(__return_storage_ptr__);
    if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,ViewBox), bVar1)) {
      SVGPatternAttributes::setViewBox(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasPreserveAspectRatio(__return_storage_ptr__);
    if ((!bVar1) &&
       (bVar1 = SVGElement::hasAttribute((SVGElement *)local_48,PreserveAspectRatio), bVar1)) {
      SVGPatternAttributes::setPreserveAspectRatio(__return_storage_ptr__,local_48);
    }
    bVar1 = SVGPatternAttributes::hasPatternContentElement(__return_storage_ptr__);
    if (!bVar1) {
      this_00 = SVGElement::children_abi_cxx11_((SVGElement *)local_48);
      __end3 = std::__cxx11::
               list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
               ::begin(this_00);
      child = (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
              std::__cxx11::
              list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
              ::end(this_00);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&child), bVar1) {
        this_01 = std::
                  _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
                  ::operator*(&__end3);
        pSVar4 = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::
                 operator->(this_01);
        uVar3 = (*pSVar4->_vptr_SVGNode[3])();
        if ((uVar3 & 1) != 0) {
          SVGPatternAttributes::setPatternContentElement(__return_storage_ptr__,local_48);
          break;
        }
        std::
        _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
        ::operator++(&__end3);
      }
    }
    this_02 = &local_48->super_SVGURIReference;
    document = SVGNode::document((SVGNode *)this);
    this_03 = (SVGPatternElement *)SVGURIReference::getTargetElement(this_02,document);
    if ((this_03 == (SVGPatternElement *)0x0) ||
       (EVar2 = SVGElement::id((SVGElement *)this_03), EVar2 != Pattern)) break;
    std::
    set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
    ::insert((set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
              *)&current,&local_48);
    local_48 = this_03;
    sVar5 = std::
            set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
            ::count((set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
                     *)&current,&local_48);
  } while (sVar5 == 0);
  SVGPatternAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
  ::~set((set<const_lunasvg::SVGPatternElement_*,_std::less<const_lunasvg::SVGPatternElement_*>,_std::allocator<const_lunasvg::SVGPatternElement_*>_>
          *)&current);
  return __return_storage_ptr__;
}

Assistant:

SVGPatternAttributes SVGPatternElement::collectPatternAttributes() const
{
    SVGPatternAttributes attributes;
    std::set<const SVGPatternElement*> processedPatterns;
    const SVGPatternElement* current = this;
    while(true) {
        if(!attributes.hasX() && current->hasAttribute(PropertyID::X))
            attributes.setX(current);
        if(!attributes.hasY() && current->hasAttribute(PropertyID::Y))
            attributes.setY(current);
        if(!attributes.hasWidth() && current->hasAttribute(PropertyID::Width))
            attributes.setWidth(current);
        if(!attributes.hasHeight() && current->hasAttribute(PropertyID::Height))
            attributes.setHeight(current);
        if(!attributes.hasPatternTransform() && current->hasAttribute(PropertyID::PatternTransform))
            attributes.setPatternTransform(current);
        if(!attributes.hasPatternUnits() && current->hasAttribute(PropertyID::PatternUnits))
            attributes.setPatternUnits(current);
        if(!attributes.hasPatternContentUnits() && current->hasAttribute(PropertyID::PatternContentUnits))
            attributes.setPatternContentUnits(current);
        if(!attributes.hasViewBox() && current->hasAttribute(PropertyID::ViewBox))
            attributes.setViewBox(current);
        if(!attributes.hasPreserveAspectRatio() && current->hasAttribute(PropertyID::PreserveAspectRatio))
            attributes.setPreserveAspectRatio(current);
        if(!attributes.hasPatternContentElement()) {
            for(const auto& child : current->children()) {
                if(child->isElement()) {
                    attributes.setPatternContentElement(current);
                    break;
                }
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || targetElement->id() != ElementID::Pattern)
            break;
        processedPatterns.insert(current);
        current = static_cast<const SVGPatternElement*>(targetElement);
        if(processedPatterns.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}